

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

Glyph * __thiscall
sf::Font::loadGlyph(Glyph *__return_storage_ptr__,Font *this,Uint32 codePoint,uint characterSize,
                   bool bold,float outlineThickness)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  void *pvVar2;
  void *pvVar3;
  pointer puVar4;
  undefined4 uVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint width;
  uint uVar15;
  float fVar16;
  IntRect IVar17;
  FT_Glyph glyphDesc;
  long local_60;
  ulong local_58;
  Page *local_50;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  IVar17 = (IntRect)ZEXT416(0);
  __return_storage_ptr__->textureRect = IVar17;
  *(IntRect *)&(__return_storage_ptr__->bounds).top = IVar17;
  __return_storage_ptr__->advance = (float)IVar17.left;
  __return_storage_ptr__->lsbDelta = IVar17.top;
  __return_storage_ptr__->rsbDelta = IVar17.width;
  (__return_storage_ptr__->bounds).left = (float)IVar17.height;
  pvVar2 = this->m_face;
  if ((((pvVar2 != (void *)0x0) && (bVar7 = setCurrentSize(this,characterSize), bVar7)) &&
      (iVar8 = FT_Load_Char(pvVar2,codePoint,(-(outlineThickness != 0.0) & 1U) * '\b' + ' '),
      iVar8 == 0)) &&
     (iVar8 = FT_Get_Glyph(*(undefined8 *)((long)pvVar2 + 0x98),&local_60), iVar8 == 0)) {
    local_48 = *(uint *)(local_60 + 0x10);
    if (local_48 == 0x6f75746c) {
      if (bold) {
        FT_Outline_Embolden(local_60 + 0x28,0x40);
      }
      if ((outlineThickness != 0.0) || (NAN(outlineThickness))) {
        pvVar3 = this->m_stroker;
        FT_Stroker_Set(pvVar3,(long)(outlineThickness * 64.0),1,0,0);
        FT_Glyph_Stroke(&local_60,pvVar3,1);
      }
    }
    FT_Glyph_To_Bitmap(&local_60,0,0,1);
    lVar6 = local_60;
    if (local_48 != 0x6f75746c) {
      if (bold) {
        FT_Bitmap_Embolden(this->m_library,local_60 + 0x30,0x40,0x40);
      }
      if ((outlineThickness != 0.0) || (NAN(outlineThickness))) {
        poVar9 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Failed to outline glyph (no fallback available)",0x2f);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
    }
    fVar16 = (float)(*(long *)(lVar6 + 0x18) >> 0x10);
    if (bold) {
      fVar16 = fVar16 + 1.0;
    }
    __return_storage_ptr__->advance = fVar16;
    uVar5 = *(undefined4 *)(*(long *)((long)pvVar2 + 0x98) + 0x118);
    __return_storage_ptr__->lsbDelta = *(undefined4 *)(*(long *)((long)pvVar2 + 0x98) + 0x110);
    __return_storage_ptr__->rsbDelta = uVar5;
    iVar8 = *(int *)(lVar6 + 0x30);
    uVar15 = *(uint *)(lVar6 + 0x34);
    if (iVar8 != 0 && uVar15 != 0) {
      width = uVar15 + 4;
      local_58 = (ulong)uVar15;
      local_50 = loadPage(this,characterSize);
      IVar17 = findGlyphRect(this,local_50,width,iVar8 + 4U);
      __return_storage_ptr__->textureRect = IVar17;
      local_48 = (__return_storage_ptr__->textureRect).left;
      uStack_44 = (__return_storage_ptr__->textureRect).top;
      uStack_40 = (__return_storage_ptr__->textureRect).width;
      uStack_3c = (__return_storage_ptr__->textureRect).height;
      (__return_storage_ptr__->textureRect).left = local_48 + 2;
      (__return_storage_ptr__->textureRect).top = uStack_44 + 2;
      (__return_storage_ptr__->textureRect).width = uStack_40 - 4;
      (__return_storage_ptr__->textureRect).height = uStack_3c - 4;
      iVar12 = *(int *)(lVar6 + 0x2c);
      (__return_storage_ptr__->bounds).left = (float)*(int *)(lVar6 + 0x28);
      (__return_storage_ptr__->bounds).top = (float)-iVar12;
      (__return_storage_ptr__->bounds).width = (float)*(uint *)(lVar6 + 0x34);
      (__return_storage_ptr__->bounds).height = (float)*(uint *)(lVar6 + 0x30);
      this_00 = &this->m_pixelBuffer;
      uVar15 = (iVar8 + 4U) * width * 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(ulong)uVar15);
      if (uVar15 != 0) {
        puVar4 = (this->m_pixelBuffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0;
        do {
          puVar1 = puVar4 + uVar11;
          puVar1[0] = 0xff;
          puVar1[1] = 0xff;
          puVar1[2] = 0xff;
          puVar1[3] = '\0';
          uVar11 = uVar11 + 4;
        } while (uVar15 != uVar11);
      }
      lVar10 = *(long *)(lVar6 + 0x40);
      uVar15 = iVar8 + 2;
      iVar8 = (int)local_58;
      if (*(char *)(lVar6 + 0x4a) == '\x01') {
        if (2 < uVar15) {
          iVar12 = iVar8 * 2 + 10;
          uVar13 = 2;
          do {
            if (2 < iVar8 + 2U) {
              uVar11 = 0;
              do {
                (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start[(ulong)(uint)(iVar12 + (int)uVar11) * 4 + 3] =
                     -((*(byte *)(lVar10 + (uVar11 >> 3 & 0x1fffffff)) >> (~(byte)uVar11 & 7) & 1)
                      != 0);
                uVar11 = uVar11 + 1;
              } while ((ulong)(iVar8 + 2U) - 2 != uVar11);
            }
            lVar10 = lVar10 + *(int *)(lVar6 + 0x38);
            uVar13 = uVar13 + 1;
            iVar12 = iVar12 + width;
          } while (uVar13 != uVar15);
        }
      }
      else if (2 < uVar15) {
        iVar12 = iVar8 * 2 + 10;
        uVar13 = 2;
        do {
          if (2 < iVar8 + 2U) {
            lVar14 = 0;
            do {
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[(ulong)(uint)(iVar12 + (int)lVar14) * 4 + 3] =
                   *(uchar *)(lVar10 + lVar14);
              lVar14 = lVar14 + 1;
            } while ((ulong)(iVar8 + 2U) - 2 != lVar14);
          }
          lVar10 = lVar10 + *(int *)(lVar6 + 0x38);
          uVar13 = uVar13 + 1;
          iVar12 = iVar12 + width;
        } while (uVar13 != uVar15);
      }
      Texture::update(&local_50->texture,
                      (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start,uStack_40,uStack_3c,local_48,
                      uStack_44);
    }
    FT_Done_Glyph(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Glyph Font::loadGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // The glyph to return
    Glyph glyph;

    // First, transform our ugly void* to a FT_Face
    FT_Face face = static_cast<FT_Face>(m_face);
    if (!face)
        return glyph;

    // Set the character size
    if (!setCurrentSize(characterSize))
        return glyph;

    // Load the glyph corresponding to the code point
    FT_Int32 flags = FT_LOAD_TARGET_NORMAL | FT_LOAD_FORCE_AUTOHINT;
    if (outlineThickness != 0)
        flags |= FT_LOAD_NO_BITMAP;
    if (FT_Load_Char(face, codePoint, flags) != 0)
        return glyph;

    // Retrieve the glyph
    FT_Glyph glyphDesc;
    if (FT_Get_Glyph(face->glyph, &glyphDesc) != 0)
        return glyph;

    // Apply bold and outline (there is no fallback for outline) if necessary -- first technique using outline (highest quality)
    FT_Pos weight = 1 << 6;
    bool outline = (glyphDesc->format == FT_GLYPH_FORMAT_OUTLINE);
    if (outline)
    {
        if (bold)
        {
            FT_OutlineGlyph outlineGlyph = reinterpret_cast<FT_OutlineGlyph>(glyphDesc);
            FT_Outline_Embolden(&outlineGlyph->outline, weight);
        }

        if (outlineThickness != 0)
        {
            FT_Stroker stroker = static_cast<FT_Stroker>(m_stroker);

            FT_Stroker_Set(stroker, static_cast<FT_Fixed>(outlineThickness * static_cast<float>(1 << 6)), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
            FT_Glyph_Stroke(&glyphDesc, stroker, true);
        }
    }

    // Convert the glyph to a bitmap (i.e. rasterize it)
    // Warning! After this line, do not read any data from glyphDesc directly, use
    // bitmapGlyph.root to access the FT_Glyph data.
    FT_Glyph_To_Bitmap(&glyphDesc, FT_RENDER_MODE_NORMAL, 0, 1);
    FT_BitmapGlyph bitmapGlyph = reinterpret_cast<FT_BitmapGlyph>(glyphDesc);
    FT_Bitmap& bitmap = bitmapGlyph->bitmap;

    // Apply bold if necessary -- fallback technique using bitmap (lower quality)
    if (!outline)
    {
        if (bold)
            FT_Bitmap_Embolden(static_cast<FT_Library>(m_library), &bitmap, weight, weight);

        if (outlineThickness != 0)
            err() << "Failed to outline glyph (no fallback available)" << std::endl;
    }

    // Compute the glyph's advance offset
    glyph.advance = static_cast<float>(bitmapGlyph->root.advance.x >> 16);
    if (bold)
        glyph.advance += static_cast<float>(weight) / static_cast<float>(1 << 6);

    glyph.lsbDelta = static_cast<int>(face->glyph->lsb_delta);
    glyph.rsbDelta = static_cast<int>(face->glyph->rsb_delta);

    unsigned int width  = bitmap.width;
    unsigned int height = bitmap.rows;

    if ((width > 0) && (height > 0))
    {
        // Leave a small padding around characters, so that filtering doesn't
        // pollute them with pixels from neighbors
        const unsigned int padding = 2;

        width += 2 * padding;
        height += 2 * padding;

        // Get the glyphs page corresponding to the character size
        Page& page = loadPage(characterSize);

        // Find a good position for the new glyph into the texture
        glyph.textureRect = findGlyphRect(page, width, height);

        // Make sure the texture data is positioned in the center
        // of the allocated texture rectangle
        glyph.textureRect.left   += static_cast<int>(padding);
        glyph.textureRect.top    += static_cast<int>(padding);
        glyph.textureRect.width  -= static_cast<int>(2 * padding);
        glyph.textureRect.height -= static_cast<int>(2 * padding);

        // Compute the glyph's bounding box
        glyph.bounds.left   = static_cast<float>( bitmapGlyph->left);
        glyph.bounds.top    = static_cast<float>(-bitmapGlyph->top);
        glyph.bounds.width  = static_cast<float>( bitmap.width);
        glyph.bounds.height = static_cast<float>( bitmap.rows);

        // Resize the pixel buffer to the new size and fill it with transparent white pixels
        m_pixelBuffer.resize(width * height * 4);

        Uint8* current = &m_pixelBuffer[0];
        Uint8* end = current + width * height * 4;

        while (current != end)
        {
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 0;
        }

        // Extract the glyph's pixels from the bitmap
        const Uint8* pixels = bitmap.buffer;
        if (bitmap.pixel_mode == FT_PIXEL_MODE_MONO)
        {
            // Pixels are 1 bit monochrome values
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = ((pixels[(x - padding) / 8]) & (1 << (7 - ((x - padding) % 8)))) ? 255 : 0;
                }
                pixels += bitmap.pitch;
            }
        }
        else
        {
            // Pixels are 8 bits gray levels
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = pixels[x - padding];
                }
                pixels += bitmap.pitch;
            }
        }

        // Write the pixels to the texture
        unsigned int x = static_cast<unsigned int>(glyph.textureRect.left) - padding;
        unsigned int y = static_cast<unsigned int>(glyph.textureRect.top) - padding;
        unsigned int w = static_cast<unsigned int>(glyph.textureRect.width) + 2 * padding;
        unsigned int h = static_cast<unsigned int>(glyph.textureRect.height) + 2 * padding;
        page.texture.update(&m_pixelBuffer[0], w, h, x, y);
    }

    // Delete the FT glyph
    FT_Done_Glyph(glyphDesc);

    // Done :)
    return glyph;
}